

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSizeLong(UninterpretedOption_NamePart *this)

{
  uint32_t *puVar1;
  string *value;
  size_t sVar2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  UninterpretedOption_NamePart *this_;
  UninterpretedOption_NamePart *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  sStack_58 = (size_t)(int)((uint)((*puVar1 & 2) != 0) << 1);
  if ((*puVar1 & 1) != 0) {
    value = _internal_name_part_abi_cxx11_(this);
    sVar2 = internal::WireFormatLite::StringSize(value);
    sStack_58 = sVar2 + 1 + sStack_58;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t UninterpretedOption_NamePart::ByteSizeLong() const {
  const UninterpretedOption_NamePart& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption.NamePart)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000002u & cached_has_bits) * 2;
   {
    // required string name_part = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name_part());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}